

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# svggeometryelement.cpp
# Opt level: O2

Rect __thiscall lunasvg::SVGGeometryElement::strokeBoundingBox(SVGGeometryElement *this)

{
  undefined1 uVar1;
  undefined1 uVar2;
  undefined2 uVar3;
  pointer pSVar4;
  undefined1 auVar5 [16];
  Rect RVar6;
  bool bVar7;
  SVGMarkerPosition *markerPosition;
  pointer this_00;
  float extraout_XMM0_Da;
  float fVar8;
  float extraout_XMM0_Db;
  char cVar15;
  uint uVar9;
  float fVar10;
  char cVar14;
  undefined8 in_XMM1_Qa;
  uint uVar16;
  undefined1 auVar13 [16];
  Rect strokeBoundingBox;
  Rect local_48;
  Rect local_38;
  undefined1 auVar11 [12];
  undefined1 auVar12 [16];
  
  (*(this->super_SVGGraphicsElement).super_SVGElement.super_SVGNode._vptr_SVGNode[0xb])();
  local_48.w = (float)in_XMM1_Qa;
  local_48.h = (float)((ulong)in_XMM1_Qa >> 0x20);
  local_48.x = extraout_XMM0_Da;
  local_48.y = extraout_XMM0_Db;
  bVar7 = SVGPaintServer::isRenderable(&this->m_stroke);
  if (bVar7) {
    fVar8 = (this->m_strokeData).m_lineWidth * 0.5;
    uVar1 = (this->m_strokeData).m_lineCap;
    uVar2 = (this->m_strokeData).m_lineJoin;
    uVar3 = *(undefined2 *)&(this->m_strokeData).field_0xe;
    cVar15 = (char)((ushort)uVar3 >> 8);
    cVar14 = (char)uVar3;
    uVar9 = CONCAT13(-(uVar1 == '\x02'),
                     CONCAT12(-(uVar1 == '\x02'),CONCAT11(-(uVar1 == '\x02'),-(uVar1 == '\x02'))));
    auVar11._0_8_ =
         CONCAT17(-(uVar2 == '\0'),
                  CONCAT16(-(uVar2 == '\0'),
                           CONCAT15(-(uVar2 == '\0'),CONCAT14(-(uVar2 == '\0'),uVar9))));
    auVar11[8] = -(cVar14 == '\0');
    auVar11[9] = -(cVar14 == '\0');
    auVar11[10] = -(cVar14 == '\0');
    auVar11[0xb] = -(cVar14 == '\0');
    auVar12[0xc] = -(cVar15 == '\0');
    auVar12._0_12_ = auVar11;
    auVar12[0xd] = -(cVar15 == '\0');
    auVar12[0xe] = -(cVar15 == '\0');
    auVar12[0xf] = -(cVar15 == '\0');
    uVar16 = (uint)((ulong)auVar11._0_8_ >> 0x20);
    auVar13._0_4_ = ~uVar9 & (uint)fVar8;
    auVar13._4_4_ = ~uVar16 & (uint)fVar8;
    auVar13._8_4_ = ~auVar11._8_4_ & (uint)fVar8;
    auVar13._12_4_ = ~auVar12._12_4_ & (uint)fVar8;
    auVar5._4_4_ = (uint)((this->m_strokeData).m_miterLimit * fVar8) & uVar16;
    auVar5._0_4_ = (uint)(fVar8 * 1.4142135) & uVar9;
    auVar5._8_4_ = (uint)(fVar8 * 0.0) & auVar11._8_4_;
    auVar5._12_4_ = (uint)(fVar8 * 0.0) & auVar12._12_4_;
    fVar10 = SUB164(auVar13 | auVar5,0);
    fVar8 = SUB164(auVar13 | auVar5,4);
    if (fVar8 <= fVar10) {
      fVar8 = fVar10;
    }
    Rect::inflate(&local_48,fVar8);
  }
  pSVar4 = (this->m_markerPositions).
           super__Vector_base<lunasvg::SVGMarkerPosition,_std::allocator<lunasvg::SVGMarkerPosition>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  for (this_00 = (this->m_markerPositions).
                 super__Vector_base<lunasvg::SVGMarkerPosition,_std::allocator<lunasvg::SVGMarkerPosition>_>
                 ._M_impl.super__Vector_impl_data._M_start; this_00 != pSVar4; this_00 = this_00 + 1
      ) {
    local_38 = SVGMarkerPosition::markerBoundingBox(this_00,(this->m_strokeData).m_lineWidth);
    Rect::unite(&local_48,&local_38);
  }
  RVar6.y = local_48.y;
  RVar6.x = local_48.x;
  RVar6.w = local_48.w;
  RVar6.h = local_48.h;
  return RVar6;
}

Assistant:

Rect SVGGeometryElement::strokeBoundingBox() const
{
    auto strokeBoundingBox = fillBoundingBox();
    if(m_stroke.isRenderable()) {
        float capLimit = m_strokeData.lineWidth() / 2.f;
        if(m_strokeData.lineCap() == LineCap::Square)
            capLimit *= PLUTOVG_SQRT2;
        float joinLimit = m_strokeData.lineWidth() / 2.f;
        if(m_strokeData.lineJoin() == LineJoin::Miter) {
            joinLimit *= m_strokeData.miterLimit();
        }

        strokeBoundingBox.inflate(std::max(capLimit, joinLimit));
    }

    for(const auto& markerPosition : m_markerPositions)
        strokeBoundingBox.unite(markerPosition.markerBoundingBox(m_strokeData.lineWidth()));
    return strokeBoundingBox;
}